

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2App.cpp
# Opt level: O1

params * ParseParams(params *__return_storage_ptr__,int Argc,cstr *Argv)

{
  cstr *ppcVar1;
  f64 *Val;
  idx2 *this;
  bool bVar2;
  bool bVar3;
  dtype dVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  undefined8 extraout_RAX;
  metadata *Meta;
  action aVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  double Eps;
  double dVar12;
  float Eps_1;
  float fVar13;
  stref Name;
  error<idx2::err_code> eVar14;
  stref sVar15;
  char DType [8];
  v3i Last3;
  v3i First3;
  FILE *local_90;
  anon_union_8_2_2df48d06_for_stref_0 local_88;
  int local_80;
  anon_union_12_8_3dedac88_for_v3<int>_1 local_74;
  anon_union_8_2_2df48d06_for_stref_0 local_68;
  uint local_60;
  cstr *local_58;
  cstr *local_50;
  array<idx2::stack_array<char,_256>_> *local_48;
  anon_union_8_2_2df48d06_for_stref_0 local_40;
  undefined4 local_38;
  
  idx2::params::params(__return_storage_ptr__);
  bVar2 = idx2::OptExists(Argc,Argv,"--encode");
  bVar3 = false;
  aVar8 = Encode;
  if (!bVar2) {
    bVar3 = idx2::OptExists(Argc,Argv,"--decode");
    if (bVar3) {
      __return_storage_ptr__->Action = Decode;
      aVar8 = Decode;
      bVar3 = false;
    }
    else {
      aVar8 = __Invalid__;
      bVar3 = true;
    }
  }
  __return_storage_ptr__->Action = aVar8;
  if (bVar3) {
    ParseParams();
LAB_00107ae9:
    ParseParams();
LAB_00107aee:
    ParseParams();
LAB_00107af3:
    ParseParams();
LAB_00107af8:
    ParseParams();
LAB_00107afd:
    ParseParams();
LAB_00107b02:
    ParseParams();
LAB_00107b07:
    ParseParams();
LAB_00107b0c:
    ParseParams();
LAB_00107b11:
    ParseParams();
LAB_00107b16:
    ParseParams();
  }
  else {
    bVar3 = idx2::OptExists(Argc,Argv,"--pause");
    __return_storage_ptr__->Pause = bVar3;
    idx2::OptVal(Argc,Argv,"--out_dir",&__return_storage_ptr__->OutDir);
    idx2::OptVal(Argc,Argv,"--out_file",&__return_storage_ptr__->OutFile);
    bVar3 = idx2::OptExists(Argc,Argv,"--dry");
    __return_storage_ptr__->OutMode = (uint)bVar3 + (uint)bVar3 * 2;
    if (__return_storage_ptr__->Action == Decode) {
      bVar3 = idx2::OptVal(Argc,Argv,"--decode",&__return_storage_ptr__->InputFile);
      if (!bVar3) goto LAB_00107aee;
      bVar3 = idx2::OptExists(Argc,Argv,"--first");
      if ((!bVar3) && (bVar3 = idx2::OptExists(Argc,Argv,"--last"), !bVar3)) {
LAB_001077f1:
        idx2::OptVal(Argc,Argv,"--downsampling",&__return_storage_ptr__->DownsamplingFactor3);
        idx2::OptVal(Argc,Argv,"--tolerance",&__return_storage_ptr__->DecodeTolerance);
        idx2::OptVal(Argc,Argv,"--in_dir",&__return_storage_ptr__->InDir);
        bVar3 = idx2::OptExists(Argc,Argv,"--in_dir");
        if (!bVar3) {
          local_40 = (anon_union_8_2_2df48d06_for_stref_0)__return_storage_ptr__->InputFile;
          sVar5 = strlen(local_40.Ptr);
          local_38 = (undefined4)sVar5;
          sVar15 = idx2::GetParentPath((stref *)&local_40);
          local_88 = sVar15.field_0;
          local_80 = sVar15.Size;
          sVar15 = idx2::GetParentPath((stref *)&local_88);
          (__return_storage_ptr__->InDir).field_0 = sVar15.field_0;
          (__return_storage_ptr__->InDir).Size = sVar15.Size;
          bVar3 = idx2::operator==(&__return_storage_ptr__->InDir,(stref *)&local_88);
          if (bVar3) {
            (__return_storage_ptr__->InDir).field_0.Ptr = "./";
            (__return_storage_ptr__->InDir).Size = 2;
          }
        }
        bVar3 = idx2::OptExists(Argc,Argv,"--brick_map");
        if (bVar3) {
          __return_storage_ptr__->OutMode = HashMap;
        }
        bVar3 = idx2::OptExists(Argc,Argv,"--parallel");
        __return_storage_ptr__->ParallelDecode = bVar3;
        return __return_storage_ptr__;
      }
      bVar3 = idx2::OptVal(Argc,Argv,"--first",(v3i *)&local_68);
      if (!bVar3) goto LAB_00107af8;
      bVar3 = idx2::OptVal(Argc,Argv,"--last",(v3i *)&local_74.field_0);
      if (bVar3) {
        (__return_storage_ptr__->DecodeExtent).From =
             (ulong)(local_60 & 0x1fffff) << 0x2a |
             ((ulong)(uint)local_68._4_4_ & 0x1fffff) << 0x15 | (ulong)local_68.Ptr & 0x1fffff;
        (__return_storage_ptr__->DecodeExtent).Dims =
             (ulong)((local_74.field_0.Z - local_60) + 1 & 0x1fffff) << 0x2a |
             (ulong)((local_74.field_0.Y - local_68._4_4_) + 1U & 0x1fffff) << 0x15 |
             (ulong)((local_74.field_0.X - local_68._0_4_) + 1U & 0x1fffff);
        goto LAB_001077f1;
      }
      goto LAB_00107afd;
    }
    if (__return_storage_ptr__->Action != Encode) {
      return __return_storage_ptr__;
    }
    ppcVar1 = &__return_storage_ptr__->InputFile;
    Meta = (metadata *)ppcVar1;
    local_50 = &__return_storage_ptr__->OutDir;
    bVar3 = idx2::OptVal(Argc,Argv,"--encode",ppcVar1);
    if (!bVar3) goto LAB_00107ae9;
    this = (idx2 *)__return_storage_ptr__->InputFile;
    sVar5 = strlen((char *)this);
    sVar15.field_0.Ptr = (str)(sVar5 & 0xffffffff);
    sVar15._8_8_ = &__return_storage_ptr__->Meta;
    eVar14 = idx2::StrToMetaData(this,sVar15,Meta);
    if (eVar14.Code == NoError) goto LAB_0010794a;
    bVar3 = idx2::OptVal(Argc,Argv,"--name",(__return_storage_ptr__->Meta).Name);
    if (!bVar3) goto LAB_00107b02;
    bVar3 = idx2::OptVal(Argc,Argv,"--field",(__return_storage_ptr__->Meta).Field);
    if (!bVar3) goto LAB_00107b07;
    bVar3 = idx2::OptVal(Argc,Argv,"--dims",&(__return_storage_ptr__->Meta).Dims3);
    if (!bVar3) goto LAB_00107b0c;
    bVar3 = idx2::OptVal(Argc,Argv,"--type",(str)&local_88);
    if (!bVar3) goto LAB_00107b11;
    sVar5 = strlen((char *)&local_88);
    Name._8_8_ = sVar5 & 0xffffffff;
    Name.field_0.Ptr = (str)&local_88;
    dVar4 = idx2::StringTo<idx2::dtype>::operator()((StringTo<idx2::dtype> *)&local_40,Name);
    (__return_storage_ptr__->Meta).DType = dVar4;
    if ((dVar4 & ~uint8) != float32) goto LAB_00107b16;
    local_40.ConstPtr = *ppcVar1;
    sVar5 = strlen(local_40.Ptr);
    local_38 = (undefined4)sVar5;
    sVar15 = idx2::GetExtension((stref *)&local_40);
    local_88 = sVar15.field_0;
    local_80 = sVar15.Size;
    local_68.Ptr = "txt";
    local_60 = 3;
    bVar3 = idx2::operator==((stref *)&local_88,(stref *)&local_68);
    if (!bVar3) {
LAB_0010794a:
      if ((__return_storage_ptr__->Meta).DType == __Invalid__) goto LAB_00107af3;
      idx2::OptVal(Argc,Argv,"--brick_size",&__return_storage_ptr__->BrickDims3);
      idx2::OptVal(Argc,Argv,"--num_levels",&__return_storage_ptr__->NLevels);
      Val = &__return_storage_ptr__->Tolerance;
      idx2::OptVal(Argc,Argv,"--tolerance",Val);
      ppcVar1 = local_50;
      if (0.0 < (double)__return_storage_ptr__->Tolerance) goto LAB_00107a2e;
      dVar4 = (__return_storage_ptr__->Meta).DType;
      if (dVar4 == float32) {
        fVar13 = 0.5;
        do {
          do {
            fVar13 = fVar13 * 0.5;
          } while (fVar13 + 1.0 != 1.0);
        } while (NAN(fVar13 + 1.0));
        dVar12 = (double)fVar13;
LAB_00107a14:
        *Val = (f64)dVar12;
      }
      else if (dVar4 == float64) {
        dVar12 = 0.5;
        do {
          do {
            dVar12 = dVar12 * 0.5;
          } while (dVar12 + 1.0 != 1.0);
        } while (NAN(dVar12 + 1.0));
        goto LAB_00107a14;
      }
      printf("tolerance = %.16f (machine epsilon)\n",*Val);
LAB_00107a2e:
      idx2::OptVal(Argc,Argv,"--bit_planes_per_chunk",&__return_storage_ptr__->BitPlanesPerChunk);
      idx2::OptVal(Argc,Argv,"--bit_planes_per_file",&__return_storage_ptr__->BitPlanesPerFile);
      idx2::OptVal(Argc,Argv,"--bricks_per_chunk",&__return_storage_ptr__->BricksPerChunk);
      idx2::OptVal(Argc,Argv,"--chunks_per_file",&__return_storage_ptr__->ChunksPerFile);
      idx2::OptVal(Argc,Argv,"--files_per_dir",&__return_storage_ptr__->FilesPerDir);
      idx2::OptVal(Argc,Argv,"--version",&__return_storage_ptr__->Version);
      idx2::OptVal(Argc,Argv,"--out_dir",ppcVar1);
      return __return_storage_ptr__;
    }
    local_90 = fopen(__return_storage_ptr__->InputFile,"rb");
    local_48 = &__return_storage_ptr__->InputFiles;
    idx2::ReadLines<256>((FILE *)local_90,local_48);
    bVar3 = (__return_storage_ptr__->InputFiles).Size == 0;
    local_58 = Argv;
    if (bVar3) {
      uVar9 = 0;
    }
    else {
      lVar10 = 0;
      lVar11 = 0;
      bVar3 = false;
      uVar9 = 0;
      do {
        local_88.Ptr = (str)((local_48->Buffer).Data + lVar10);
        sVar5 = strlen(local_88.Ptr);
        local_80 = (int)sVar5;
        uVar6 = idx2::GetFileSize((stref *)&local_88);
        if (lVar11 == 0) {
          uVar9 = uVar6;
        }
        if (uVar6 != uVar9) break;
        lVar11 = lVar11 + 1;
        lVar10 = lVar10 + 0x101;
        bVar3 = lVar11 == (__return_storage_ptr__->InputFiles).Size;
      } while (!bVar3);
    }
    Argv = local_58;
    if (bVar3) {
      uVar7 = (ulong)(__return_storage_ptr__->Meta).DType;
      uVar6 = 0xffffffffffffffff;
      if (uVar7 < 10) {
        uVar6 = *(ulong *)(&DAT_001b2fd8 + uVar7 * 8);
      }
      if ((uVar6 & uVar9) != 0) goto LAB_00107b20;
      if (bVar3) {
        if (local_90 != (FILE *)0x0) {
          fclose(local_90);
        }
        goto LAB_0010794a;
      }
    }
  }
  ParseParams();
LAB_00107b20:
  ParseParams();
  if (local_90 != (FILE *)0x0) {
    fclose(local_90);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

params
ParseParams(int Argc, cstr* Argv)
{
  params P;

  P.Action = OptExists(Argc, Argv, "--encode")   ? action::Encode
             : OptExists(Argc, Argv, "--decode") ? P.Action = action::Decode
                                                 : action::__Invalid__;

  idx2_ExitIf(P.Action == action::__Invalid__,
              "Provide either --encode or --decode\n"
              "Example 1: --encode /Users/abc/Miranda-Density-[384-384-256]-Float64.raw\n"
              "Example 2: --encode Miranda-Density-[384-384-256]-Float64.raw\n"
              "Example 3: --decode /Users/abc/Miranda/Density.idx2\n"
              "Example 4: --decode Miranda/Density.idx2\n");

  //// Parse the input file (--input)
  //idx2_ExitIf(!OptVal(Argc, Argv, "--input", &P.InputFile),
  //            "Provide --input\n"
  //            "Example: --input /Users/abc/MIRANDA-DENSITY-[384-384-256]-Float64.raw\n");

  // Parse the pause option (--pause): wait for keyboard input at the end
  P.Pause = OptExists(Argc, Argv, "--pause");

  // Parse the optional output directory (--out_dir)
  OptVal(Argc, Argv, "--out_dir", &P.OutDir);
  // Parse the optional output file (--out_file)
  OptVal(Argc, Argv, "--out_file", &P.OutFile);

  // Parse the dry run option (--dry): if enabled, skip writing the output file
  P.OutMode =
    OptExists(Argc, Argv, "--dry") ? params::out_mode::NoOutput : params::out_mode::RegularGridFile;

  // Perform parsing depending on the action
  if (P.Action == action::Encode)
    ParseEncodeOptions(Argc, Argv, &P);
  else if (P.Action == action::Decode)
    ParseDecodeOptions(Argc, Argv, &P);

  return P;
}